

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O2

SpatialRigidBodyInertia *
RigidBodyDynamics::Math::SpatialRigidBodyInertia::createFromMassComInertiaC
          (SpatialRigidBodyInertia *__return_storage_ptr__,Scalar mass,Vector3d *com,
          Matrix3d *inertia_C)

{
  Matrix3d I;
  undefined1 local_128 [16];
  scalar_constant_op<double> local_118;
  Scalar local_108;
  Scalar local_100;
  Scalar local_e8;
  Matrix3d *local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  Scalar local_c0;
  undefined8 local_a8 [2];
  undefined4 local_98;
  uint uStack_94;
  undefined4 uStack_90;
  uint uStack_8c;
  undefined8 local_88;
  double local_80;
  undefined4 local_78;
  uint uStack_74;
  undefined4 uStack_70;
  uint uStack_6c;
  undefined8 local_68;
  undefined8 local_60 [2];
  undefined4 local_50;
  uint uStack_4c;
  undefined4 uStack_48;
  uint uStack_44;
  undefined8 local_40;
  double local_38;
  undefined4 local_30;
  uint uStack_2c;
  double local_28;
  undefined8 local_20;
  
  SpatialRigidBodyInertia(__return_storage_ptr__);
  __return_storage_ptr__->m = mass;
  local_128._0_8_ = com;
  local_118.m_other = mass;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&(__return_storage_ptr__->h).super_Vector3d,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_128);
  local_80 = (com->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
  uStack_70 = SUB84(local_80,0);
  local_d8 = local_60;
  local_60[0] = 0;
  local_40 = 0;
  uStack_6c = (uint)((ulong)local_80 >> 0x20) ^ 0x80000000;
  local_28 = -local_80;
  local_98 = *(undefined4 *)
              ((com->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array + 1);
  uStack_74 = *(uint *)((long)(com->super_Vector3d).
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array + 0xc);
  uStack_90 = *(undefined4 *)
               ((com->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array + 2);
  uStack_94 = uStack_74 ^ 0x80000000;
  uStack_8c = *(uint *)((long)(com->super_Vector3d).
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array + 0x14) ^ 0x80000000;
  local_20 = 0;
  local_d0 = local_a8;
  local_a8[0] = 0;
  local_88 = 0;
  local_68 = 0;
  local_e0 = inertia_C;
  local_c0 = mass;
  local_78 = local_98;
  local_50 = local_98;
  uStack_4c = uStack_94;
  uStack_48 = uStack_90;
  uStack_44 = uStack_8c;
  local_38 = local_80;
  local_30 = local_98;
  uStack_2c = uStack_74;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_128,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>_>
              *)&local_e0);
  __return_storage_ptr__->Ixx = (Scalar)local_128._0_8_;
  __return_storage_ptr__->Iyx = (Scalar)local_128._8_8_;
  __return_storage_ptr__->Iyy = local_108;
  __return_storage_ptr__->Izx = local_118.m_other;
  __return_storage_ptr__->Izy = local_100;
  __return_storage_ptr__->Izz = local_e8;
  return __return_storage_ptr__;
}

Assistant:

static SpatialRigidBodyInertia createFromMassComInertiaC (Scalar mass, const Vector3d &com, const Matrix3d &inertia_C) {
    SpatialRigidBodyInertia result;
    result.m = mass;
    result.h = com * mass;
    Matrix3d I = inertia_C + VectorCrossMatrix (com) * VectorCrossMatrix(com).transpose() * mass;
    result.Ixx = I(0,0);
    result.Iyx = I(1,0);
    result.Iyy = I(1,1);
    result.Izx = I(2,0);
    result.Izy = I(2,1);
    result.Izz = I(2,2);
    return result;
  }